

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O3

BOOL __thiscall
Js::TypedArray<short,_false,_false>::DirectSetItemAtRange
          (TypedArray<short,_false,_false> *this,TypedArray<short,_false,_false> *fromArray,
          int32 iSrcStart,int32 iDstStart,uint32 length,_func_short_Var_ScriptContext_ptr *convFunc)

{
  uint uVar1;
  Type puVar2;
  Type puVar3;
  JavascriptLibrary *pJVar4;
  code *pcVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  bool bVar13;
  short sVar14;
  undefined4 *puVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  uint32 uVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  long lVar24;
  undefined8 extraout_XMM1_Qa;
  undefined8 extraout_XMM1_Qa_00;
  undefined8 extraout_XMM1_Qa_01;
  undefined1 in_XMM1 [16];
  undefined8 extraout_XMM1_Qb;
  undefined8 extraout_XMM1_Qb_00;
  undefined8 extraout_XMM1_Qb_01;
  undefined1 auVar25 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar26 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar27 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar35 [16];
  
  puVar2 = (this->super_TypedArrayBase).buffer;
  puVar3 = (fromArray->super_TypedArrayBase).buffer;
  if (puVar3 == (Type)0x0 || puVar2 == (Type)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb;
    in_XMM1._0_8_ = extraout_XMM1_Qa;
    *puVar15 = 1;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                 ,0x156,"(srcBuffer && dstBuffer)","srcBuffer && dstBuffer");
    if (!bVar13) goto LAB_00ac5e4a;
    *puVar15 = 0;
  }
  if (0x3fffffff < length) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb_00;
    in_XMM1._0_8_ = extraout_XMM1_Qa_00;
    *puVar15 = 1;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                 ,0x157,
                                 "(length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName))",
                                 "length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName)");
    if (!bVar13) goto LAB_00ac5e4a;
    *puVar15 = 0;
  }
  if (iSrcStart != iDstStart) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar15 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    in_XMM1._8_8_ = extraout_XMM1_Qb_01;
    in_XMM1._0_8_ = extraout_XMM1_Qa_01;
    *puVar15 = 1;
    bVar13 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/TypedArray.h"
                                 ,0x159,"(iSrcStart == iDstStart)","iSrcStart == iDstStart");
    if (!bVar13) {
LAB_00ac5e4a:
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar15 = 0;
  }
  if ((((this->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached == false)
     && (((fromArray->super_TypedArrayBase).super_ArrayBufferParent.arrayBuffer.ptr)->isDetached !=
         true)) {
    if (iDstStart < 0) {
      if ((long)((long)iDstStart + (ulong)length) < 0) {
        return 1;
      }
      uVar19 = length + iDstStart;
      uVar22 = 0;
    }
    else {
      uVar19 = length;
      uVar22 = iDstStart;
      if (CARRY4(length,iDstStart)) {
        ::Math::DefaultOverflowPolicy();
      }
    }
    uVar1 = (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
    uVar16 = (ulong)(uVar1 - uVar22);
    if (uVar1 < uVar22) {
      uVar16 = 0;
    }
    if (length + iDstStart < uVar1) {
      uVar16 = (ulong)uVar19;
    }
    uVar1 = (fromArray->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.length;
    uVar20 = uVar1 - uVar22;
    if (uVar1 < uVar22) {
      uVar20 = 0;
    }
    if (length + iDstStart < uVar1) {
      uVar20 = uVar19;
    }
    if (uVar19 < uVar20) {
      uVar20 = uVar19;
    }
    uVar21 = uVar16;
    if (uVar20 < (uint)uVar16) {
      uVar21 = (ulong)uVar20;
    }
    js_memcpy_s(puVar2 + (ulong)uVar22 * 2,uVar16 * 2,puVar3 + (ulong)uVar22 * 2,uVar21 * 2);
    if (uVar20 < (uint)uVar16) {
      pJVar4 = (((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                 super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr;
      sVar14 = (*convFunc)((pJVar4->super_JavascriptLibraryBase).undefinedValue.ptr,
                           (pJVar4->super_JavascriptLibraryBase).scriptContext.ptr);
      auVar12 = _DAT_00fa8550;
      lVar17 = (uVar16 - uVar21) + -1;
      auVar23._8_4_ = (int)lVar17;
      auVar23._0_8_ = lVar17;
      auVar23._12_4_ = (int)((ulong)lVar17 >> 0x20);
      uVar18 = 0;
      auVar25 = pmovsxbq(in_XMM1,0x706);
      auVar26 = pmovsxbq(in_XMM2,0x504);
      auVar27 = pmovsxbq(in_XMM3,0x302);
      auVar28 = pmovsxbq(in_XMM4,0x100);
      auVar23 = auVar23 ^ _DAT_00fa8550;
      do {
        auVar29._8_4_ = (int)uVar18;
        auVar29._0_8_ = uVar18;
        auVar29._12_4_ = (int)(uVar18 >> 0x20);
        auVar31 = (auVar29 | auVar28) ^ auVar12;
        lVar17 = auVar23._0_8_;
        auVar32._0_8_ = -(ulong)(lVar17 < auVar31._0_8_);
        lVar24 = auVar23._8_8_;
        auVar32._8_8_ = -(ulong)(lVar24 < auVar31._8_8_);
        auVar35 = pshuflw(in_XMM9,auVar32,0xe8);
        auVar31._8_4_ = 0xffffffff;
        auVar31._0_8_ = 0xffffffffffffffff;
        auVar31._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar35 ^ auVar31,auVar35 ^ auVar31);
        if ((auVar31 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(short *)(puVar2 + uVar18 * 2 + uVar21 * 2) = sVar14;
        }
        auVar32 = packssdw(auVar32,auVar32);
        auVar35._8_4_ = 0xffffffff;
        auVar35._0_8_ = 0xffffffffffffffff;
        auVar35._12_4_ = 0xffffffff;
        auVar32 = packssdw(auVar32 ^ auVar35,auVar32 ^ auVar35);
        if ((auVar32 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(short *)(puVar2 + uVar18 * 2 + uVar21 * 2 + 2) = sVar14;
        }
        auVar32 = (auVar29 | auVar27) ^ auVar12;
        auVar33._0_8_ = -(ulong)(lVar17 < auVar32._0_8_);
        auVar33._8_8_ = -(ulong)(lVar24 < auVar32._8_8_);
        auVar31 = packssdw(auVar31,auVar33);
        auVar6._8_4_ = 0xffffffff;
        auVar6._0_8_ = 0xffffffffffffffff;
        auVar6._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31 ^ auVar6,auVar31 ^ auVar6);
        if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(short *)(puVar2 + uVar18 * 2 + uVar21 * 2 + 4) = sVar14;
        }
        auVar32 = pshufhw(auVar33,auVar33,0x84);
        auVar7._8_4_ = 0xffffffff;
        auVar7._0_8_ = 0xffffffffffffffff;
        auVar7._12_4_ = 0xffffffff;
        auVar32 = packssdw(auVar32 ^ auVar7,auVar32 ^ auVar7);
        if ((auVar32 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(short *)(puVar2 + uVar18 * 2 + uVar21 * 2 + 6) = sVar14;
        }
        auVar32 = (auVar29 | auVar26) ^ auVar12;
        auVar34._0_8_ = -(ulong)(lVar17 < auVar32._0_8_);
        auVar34._8_8_ = -(ulong)(lVar24 < auVar32._8_8_);
        auVar31 = pshuflw(auVar31,auVar34,0xe8);
        auVar8._8_4_ = 0xffffffff;
        auVar8._0_8_ = 0xffffffffffffffff;
        auVar8._12_4_ = 0xffffffff;
        in_XMM9 = packssdw(auVar31 ^ auVar8,auVar31 ^ auVar8);
        if ((in_XMM9 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          *(short *)(puVar2 + uVar18 * 2 + uVar21 * 2 + 8) = sVar14;
        }
        auVar31 = packssdw(auVar34,auVar34);
        auVar9._8_4_ = 0xffffffff;
        auVar9._0_8_ = 0xffffffffffffffff;
        auVar9._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31 ^ auVar9,auVar31 ^ auVar9);
        if ((auVar31 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
          *(short *)(puVar2 + uVar18 * 2 + uVar21 * 2 + 10) = sVar14;
        }
        auVar29 = (auVar29 | auVar25) ^ auVar12;
        auVar30._0_8_ = -(ulong)(lVar17 < auVar29._0_8_);
        auVar30._8_8_ = -(ulong)(lVar24 < auVar29._8_8_);
        auVar31 = packssdw(auVar31,auVar30);
        auVar10._8_4_ = 0xffffffff;
        auVar10._0_8_ = 0xffffffffffffffff;
        auVar10._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31 ^ auVar10,auVar31 ^ auVar10);
        if ((auVar31 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
          *(short *)(puVar2 + uVar18 * 2 + uVar21 * 2 + 0xc) = sVar14;
        }
        auVar31 = pshufhw(auVar30,auVar30,0x84);
        auVar11._8_4_ = 0xffffffff;
        auVar11._0_8_ = 0xffffffffffffffff;
        auVar11._12_4_ = 0xffffffff;
        auVar31 = packssdw(auVar31 ^ auVar11,auVar31 ^ auVar11);
        if ((auVar31 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
          *(short *)(puVar2 + uVar18 * 2 + uVar21 * 2 + 0xe) = sVar14;
        }
        uVar18 = uVar18 + 8;
      } while (((uVar16 - uVar21) + 7 & 0xfffffffffffffff8) != uVar18);
    }
    return 1;
  }
  JavascriptError::ThrowTypeError
            ((((((this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.
                 super_DynamicObject.super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ebe5,(PCWSTR)0x0);
}

Assistant:

inline BOOL DirectSetItemAtRange(TypedArray *fromArray, __in int32 iSrcStart, __in int32 iDstStart, __in uint32 length, TypeName(*convFunc)(Var value, ScriptContext* scriptContext))
        {
            TypeName* dstBuffer = (TypeName*)buffer;
            TypeName* srcBuffer = (TypeName*)fromArray->buffer;
            Assert(srcBuffer && dstBuffer);
            Assert(length <= ArrayBuffer::MaxArrayBufferLength / sizeof(TypeName));
            // caller checks that src and dst index are the same
            Assert(iSrcStart == iDstStart);

            if (this->IsDetachedBuffer() || fromArray->IsDetachedBuffer())
            {
                JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_DetachedTypedArray);
            }

            // Fixup destination start in case it's negative
            uint32 start = iDstStart;
            if (iDstStart < 0)
            {
                if ((int64)(length) + iDstStart < 0)
                {
                    // nothing to do, all index are no-op
                    return true;
                }

                length += iDstStart;
                start = 0;
            }

            uint32 dstLength = UInt32Math::Add(start, length) < GetLength() ? length : GetLength() > start ? GetLength() - start : 0;
            uint32 srcLength = start + length < fromArray->GetLength() ? length : (fromArray->GetLength() > start ? fromArray->GetLength() - start : 0);

            // length is the minimum of length, srcLength and dstLength
            length = length < srcLength ? (length < dstLength ? length : dstLength) : (srcLength < dstLength ? srcLength : dstLength);

            const size_t byteSize = sizeof(TypeName) * length;
            Assert(byteSize >= length); // check for overflow
            js_memcpy_s(dstBuffer + start, dstLength * sizeof(TypeName), srcBuffer + start, byteSize);

            if (dstLength > length)
            {
                TypeName undefinedValue = convFunc(GetLibrary()->GetUndefined(), GetScriptContext());
                for (uint32 i = length; i < dstLength; i++)
                {
                    dstBuffer[i] = undefinedValue;
                }
            }

            return true;
        }